

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

wchar_t cmp_ignore(void *a,void *b)

{
  ignore_choice *y;
  ignore_choice *x;
  char bufb [80];
  char bufa [80];
  void *b_local;
  void *a_local;
  
  if (((*(byte *)((long)a + 8) & 1) == 0) && ((*(byte *)((long)b + 8) & 1) != 0)) {
    a_local._4_4_ = L'\x01';
  }
  else if (((*(byte *)((long)a + 8) & 1) == 0) || ((*(byte *)((long)b + 8) & 1) != 0)) {
    object_kind_name(bufb + 0x48,0x50,*a,(_Bool)(*(byte *)((long)a + 8) & 1));
    object_kind_name((char *)&x,0x50,*b,(_Bool)(*(byte *)((long)b + 8) & 1));
    a_local._4_4_ = strcmp(bufb + 0x48,(char *)&x);
  }
  else {
    a_local._4_4_ = L'\xffffffff';
  }
  return a_local._4_4_;
}

Assistant:

static int cmp_ignore(const void *a, const void *b)
{
	char bufa[80];
	char bufb[80];
	const ignore_choice *x = a;
	const ignore_choice *y = b;

	if (!x->aware && y->aware)
		return 1;
	if (x->aware && !y->aware)
		return -1;

	object_kind_name(bufa, sizeof(bufa), x->kind, x->aware);
	object_kind_name(bufb, sizeof(bufb), y->kind, y->aware);

	return strcmp(bufa, bufb);
}